

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

char * testing::internal::StringFromGTestEnv(char *flag,char *default_value)

{
  char *pcVar1;
  char *in_RDX;
  undefined1 local_40 [8];
  string env_var;
  
  FlagToEnvVar_abi_cxx11_((string *)local_40,(internal *)flag,in_RDX);
  pcVar1 = getenv((char *)local_40);
  if (local_40 != (undefined1  [8])&env_var._M_string_length) {
    operator_delete((void *)local_40);
  }
  if (pcVar1 != (char *)0x0) {
    default_value = pcVar1;
  }
  return default_value;
}

Assistant:

const char* StringFromGTestEnv(const char* flag, const char* default_value) {
  const std::string env_var = FlagToEnvVar(flag);
  const char* const value = posix::GetEnv(env_var.c_str());
  return value == NULL ? default_value : value;
}